

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_do_more(Curl_easy *data,int *completep)

{
  _Bool _Var1;
  CURLcode CVar2;
  char *local_58;
  _Bool local_41;
  long lStack_40;
  _Bool serv_conned;
  FTP *ftp;
  _Bool complete;
  _Bool connected;
  anon_union_280_10_9f9d5394_for_proto *paStack_30;
  CURLcode result;
  ftp_conn *ftpc;
  connectdata *conn;
  int *completep_local;
  Curl_easy *data_local;
  
  ftpc = (ftp_conn *)data->conn;
  paStack_30 = &((connectdata *)ftpc)->proto;
  ftp._4_4_ = CURLE_OK;
  ftp._3_1_ = 0;
  ftp._2_1_ = 0;
  lStack_40 = 0;
  conn = (connectdata *)completep;
  completep_local = (int *)data;
  if ((((connectdata *)ftpc)->cfilter[1] == (Curl_cfilter *)0x0) ||
     ((ftp._4_4_ = Curl_conn_connect(data,1,false,(_Bool *)((long)&ftp + 3)), ftp._4_4_ == CURLE_OK
      && (_Var1 = Curl_conn_is_ip_connected((Curl_easy *)completep_local,1), _Var1)))) {
    lStack_40 = *(long *)(completep_local + 0x6e);
    if ((paStack_30->ftpc).state != '\0') {
      CVar2 = ftp_multi_statemach((Curl_easy *)completep_local,(_Bool *)((long)&ftp + 2));
      *(uint *)&(conn->cpool_node)._list = (uint)(ftp._2_1_ & 1);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      if ((*(byte *)((long)paStack_30 + 0x112) >> 5 & 1) == 0) {
        return CURLE_OK;
      }
      *(undefined4 *)&(conn->cpool_node)._list = 0;
      ftp._4_4_ = CURLE_OK;
    }
    if (*(uint *)(lStack_40 + 0x10) < 2) {
      if ((*(byte *)((long)paStack_30 + 0x112) >> 5 & 1) == 0) {
        if (((uint)completep_local[0x4f5] >> 0x11 & 1) == 0) {
          *(undefined8 *)(lStack_40 + 0x18) = 0xffffffffffffffff;
          ftp._4_4_ = Curl_range((Curl_easy *)completep_local);
          if ((ftp._4_4_ == CURLE_OK) && (-1 < *(long *)(completep_local + 0x3e))) {
            *(byte *)((long)paStack_30 + 0x112) = *(byte *)((long)paStack_30 + 0x112) & 0xfd | 2;
          }
          if (ftp._4_4_ == CURLE_OK) {
            if ((((uint)completep_local[0x4f5] >> 0xd & 1) == 0) &&
               ((paStack_30->ftpc).file != (char *)0x0)) {
              CVar2 = ftp_nb_type((Curl_easy *)completep_local,(connectdata *)ftpc,
                                  ((uint)completep_local[0x4f5] >> 0xc & 1) != 0,'\x15');
              if (CVar2 != CURLE_OK) {
                return CVar2;
              }
              ftp._4_4_ = CURLE_OK;
            }
            else if (*(int *)(lStack_40 + 0x10) == 0) {
              CVar2 = ftp_nb_type((Curl_easy *)completep_local,(connectdata *)ftpc,true,'\x14');
              if (CVar2 != CURLE_OK) {
                return CVar2;
              }
              ftp._4_4_ = CURLE_OK;
            }
          }
          CVar2 = ftp_multi_statemach((Curl_easy *)completep_local,(_Bool *)((long)&ftp + 2));
          *(uint *)&(conn->cpool_node)._list = (uint)(ftp._2_1_ & 1);
        }
        else {
          ftp._4_4_ = ftp_nb_type((Curl_easy *)completep_local,(connectdata *)ftpc,
                                  ((uint)completep_local[0x4f5] >> 0xc & 1) != 0,'\x16');
          if (ftp._4_4_ != CURLE_OK) {
            return ftp._4_4_;
          }
          CVar2 = ftp_multi_statemach((Curl_easy *)completep_local,(_Bool *)((long)&ftp + 2));
          *(uint *)&(conn->cpool_node)._list = (uint)(ftp._2_1_ & 1);
        }
      }
      else {
        ftp._4_4_ = ReceivedServerConnect((Curl_easy *)completep_local,&local_41);
        if (ftp._4_4_ != CURLE_OK) {
          return ftp._4_4_;
        }
        CVar2 = CURLE_OK;
        if ((local_41 & 1U) != 0) {
          ftp._4_4_ = AcceptServerConnect((Curl_easy *)completep_local);
          *(byte *)((long)paStack_30 + 0x112) = *(byte *)((long)paStack_30 + 0x112) & 0xdf;
          if (ftp._4_4_ == CURLE_OK) {
            ftp._4_4_ = InitiateTransfer((Curl_easy *)completep_local);
          }
          if (ftp._4_4_ != CURLE_OK) {
            return ftp._4_4_;
          }
          *(undefined4 *)&(conn->cpool_node)._list = 1;
          CVar2 = ftp._4_4_;
        }
      }
      ftp._4_4_ = CVar2;
      data_local._4_4_ = ftp._4_4_;
    }
    else {
      Curl_xfer_setup_nop((Curl_easy *)completep_local);
      if ((((((*(byte *)((long)paStack_30 + 0x112) >> 5 & 1) == 0) &&
            (*(undefined4 *)&(conn->cpool_node)._list = 1, completep_local != (int *)0x0)) &&
           ((*(ulong *)((long)completep_local + 0xa9a) >> 0x1c & 1) != 0)) &&
          ((*(long *)(completep_local + 0x4ca) == 0 ||
           (0 < *(int *)(*(long *)(completep_local + 0x4ca) + 8))))) &&
         (0 < Curl_trc_feat_ftp.log_level)) {
        if ((completep_local == (int *)0x0) || (*(long *)(completep_local + 6) == 0)) {
          local_58 = "???";
        }
        else {
          local_58 = ftp_state_names[*(byte *)(*(long *)(completep_local + 6) + 0x54e)];
        }
        Curl_trc_ftp((Curl_easy *)completep_local,"[%s] DO-MORE phase ends with %d",local_58,
                     (ulong)ftp._4_4_);
      }
      data_local._4_4_ = ftp._4_4_;
    }
  }
  else if ((ftp._4_4_ == CURLE_OK) || ((paStack_30->ftpc).count1 != 0)) {
    data_local._4_4_ = ftp._4_4_;
  }
  else {
    *(undefined4 *)&(conn->cpool_node)._list = 0xffffffff;
    data_local._4_4_ = ftp_epsv_disable((Curl_easy *)completep_local,(connectdata *)ftpc);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_do_more(struct Curl_easy *data, int *completep)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = CURLE_OK;
  bool connected = FALSE;
  bool complete = FALSE;

  /* the ftp struct is inited in ftp_connect(). If we are connecting to an HTTP
   * proxy then the state will not be valid until after that connection is
   * complete */
  struct FTP *ftp = NULL;

  /* if the second connection is not done yet, wait for it to have
   * connected to the remote host. When using proxy tunneling, this
   * means the tunnel needs to have been establish. However, we
   * can not expect the remote host to talk to us in any way yet.
   * So, when using ftps: the SSL handshake will not start until we
   * tell the remote server that we are there. */
  if(conn->cfilter[SECONDARYSOCKET]) {
    result = Curl_conn_connect(data, SECONDARYSOCKET, FALSE, &connected);
    if(result || !Curl_conn_is_ip_connected(data, SECONDARYSOCKET)) {
      if(result && (ftpc->count1 == 0)) {
        *completep = -1; /* go back to DOING please */
        /* this is a EPSV connect failing, try PASV instead */
        return ftp_epsv_disable(data, conn);
      }
      return result;
    }
  }

  /* Curl_proxy_connect might have moved the protocol state */
  ftp = data->req.p.ftp;

  if(ftpc->state) {
    /* already in a state so skip the initial commands.
       They are only done to kickstart the do_more state */
    result = ftp_multi_statemach(data, &complete);

    *completep = (int)complete;

    /* if we got an error or if we do not wait for a data connection return
       immediately */
    if(result || !ftpc->wait_data_conn)
      return result;

    /* if we reach the end of the FTP state machine here, *complete will be
       TRUE but so is ftpc->wait_data_conn, which says we need to wait for the
       data connection and therefore we are not actually complete */
    *completep = 0;
  }

  if(ftp->transfer <= PPTRANSFER_INFO) {
    /* a transfer is about to take place, or if not a filename was given so we
       will do a SIZE on it later and then we need the right TYPE first */

    if(ftpc->wait_data_conn) {
      bool serv_conned;

      result = ReceivedServerConnect(data, &serv_conned);
      if(result)
        return result; /* Failed to accept data connection */

      if(serv_conned) {
        /* It looks data connection is established */
        result = AcceptServerConnect(data);
        ftpc->wait_data_conn = FALSE;
        if(!result)
          result = InitiateTransfer(data);

        if(result)
          return result;

        *completep = 1; /* this state is now complete when the server has
                           connected back to us */
      }
    }
    else if(data->state.upload) {
      result = ftp_nb_type(data, conn, data->state.prefer_ascii,
                           FTP_STOR_TYPE);
      if(result)
        return result;

      result = ftp_multi_statemach(data, &complete);
      *completep = (int)complete;
    }
    else {
      /* download */
      ftp->downloadsize = -1; /* unknown as of yet */

      result = Curl_range(data);

      if(result == CURLE_OK && data->req.maxdownload >= 0) {
        /* Do not check for successful transfer */
        ftpc->dont_check = TRUE;
      }

      if(result)
        ;
      else if(data->state.list_only || !ftpc->file) {
        /* The specified path ends with a slash, and therefore we think this
           is a directory that is requested, use LIST. But before that we
           need to set ASCII transfer mode. */

        /* But only if a body transfer was requested. */
        if(ftp->transfer == PPTRANSFER_BODY) {
          result = ftp_nb_type(data, conn, TRUE, FTP_LIST_TYPE);
          if(result)
            return result;
        }
        /* otherwise just fall through */
      }
      else {
        result = ftp_nb_type(data, conn, data->state.prefer_ascii,
                             FTP_RETR_TYPE);
        if(result)
          return result;
      }

      result = ftp_multi_statemach(data, &complete);
      *completep = (int)complete;
    }
    return result;
  }

  /* no data to transfer */
  Curl_xfer_setup_nop(data);

  if(!ftpc->wait_data_conn) {
    /* no waiting for the data connection so this is now complete */
    *completep = 1;
    CURL_TRC_FTP(data, "[%s] DO-MORE phase ends with %d", FTP_DSTATE(data),
                 (int)result);
  }

  return result;
}